

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

char * checkInterfacePropertyCompatibility<char_const*>
                 (cmGeneratorTarget *tgt,string *p,string *config,char *defaultValue,
                 CompatibleType t,char **param_6)

{
  bool bVar1;
  pointer pbVar2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var3;
  size_t sVar4;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  char *pcVar6;
  ostream *poVar7;
  pointer ppcVar8;
  char *pcVar9;
  bool bVar10;
  pair<bool,_const_char_*> pVar11;
  string reportEntry;
  string report;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propKeys;
  ostringstream e;
  string interfaceProperty;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headPropKeys;
  char *local_2b0;
  string local_2a0;
  cmGeneratorTarget *local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_278;
  cmGeneratorTarget *local_270;
  long *local_268;
  long local_258 [2];
  string local_248;
  _Base_ptr local_228;
  _Base_ptr local_220;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_210;
  char *local_208;
  pointer local_200;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  string local_1e0 [3];
  ios_base local_170 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_208 = defaultValue;
  local_2b0 = cmGeneratorTarget::GetProperty(tgt,p);
  cmGeneratorTarget::GetPropertyKeys_abi_cxx11_(&local_48,tgt);
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    (local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,p);
  bVar10 = _Var3._M_current !=
           local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_220 = (_Base_ptr)
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(tgt->LinkImplicitNullProperties)._M_t,p);
  local_210 = local_48.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_228 = &(tgt->LinkImplicitNullProperties)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (local_220 != local_228 &&
      _Var3._M_current !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("(impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0xf5e,
                  "PropertyType checkInterfacePropertyCompatibility(const cmGeneratorTarget *, const std::string &, const std::string &, const char *, CompatibleType, PropertyType *) [PropertyType = const char *]"
                 );
  }
  local_280 = tgt;
  local_218 = cmGeneratorTarget::GetLinkImplementationClosure(tgt,config);
  if ((local_218->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (local_218->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_248," * Target \"","");
    std::__cxx11::string::_M_append
              ((char *)&local_248,(ulong)(local_280->Target->Name)._M_dataplus._M_p);
    if (_Var3._M_current != local_210) {
      std::__cxx11::string::append((char *)&local_248);
      pcVar6 = "(unset)";
      if (local_2b0 != (char *)0x0) {
        pcVar6 = local_2b0;
      }
      local_1e0[0]._M_dataplus._M_p = (pointer)&local_1e0[0].field_2;
      sVar4 = strlen(pcVar6);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,pcVar6,pcVar6 + sVar4);
      std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_1e0[0]._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0[0]._M_dataplus._M_p != &local_1e0[0].field_2) {
        operator_delete(local_1e0[0]._M_dataplus._M_p,local_1e0[0].field_2._M_allocated_capacity + 1
                       );
      }
    }
    std::__cxx11::string::append((char *)&local_248);
    std::operator+(&local_68,"INTERFACE_",p);
    ppcVar8 = (local_218->
              super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (ppcVar8 !=
        (local_218->
        super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      local_278 = _Var3._M_current;
      do {
        local_270 = *ppcVar8;
        local_200 = ppcVar8;
        cmGeneratorTarget::GetPropertyKeys_abi_cxx11_(&local_1f8,local_270);
        _Var5 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          (local_1f8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           local_1f8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_68);
        pbVar2 = local_1f8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pcVar6 = cmGeneratorTarget::GetProperty(local_270,&local_68);
        local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
        local_2a0._M_string_length = 0;
        local_2a0.field_2._M_local_buf[0] = '\0';
        if (_Var5._M_current != pbVar2) {
          std::__cxx11::string::append((char *)&local_2a0);
          std::__cxx11::string::_M_append
                    ((char *)&local_2a0,(ulong)(local_270->Target->Name)._M_dataplus._M_p);
          std::__cxx11::string::append((char *)&local_2a0);
          pcVar9 = pcVar6;
          if (pcVar6 == (char *)0x0) {
            pcVar9 = "(unset)";
          }
          local_1e0[0]._M_dataplus._M_p = (pointer)&local_1e0[0].field_2;
          sVar4 = strlen(pcVar9);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,pcVar9,pcVar9 + sVar4)
          ;
          std::__cxx11::string::_M_append((char *)&local_2a0,(ulong)local_1e0[0]._M_dataplus._M_p);
          _Var3._M_current = local_278;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e0[0]._M_dataplus._M_p != &local_1e0[0].field_2) {
            operator_delete(local_1e0[0]._M_dataplus._M_p,
                            local_1e0[0].field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)&local_2a0);
        }
        pcVar9 = local_2b0;
        if (_Var3._M_current == local_210) {
          if (local_220 == local_228) {
            if (_Var5._M_current != pbVar2) {
              if (!bVar10) {
                local_1e0[0]._M_dataplus._M_p = (pointer)&local_1e0[0].field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_1e0,local_2a0._M_dataplus._M_p,
                           local_2a0._M_dataplus._M_p + local_2a0._M_string_length);
                std::__cxx11::string::append((char *)local_1e0);
                std::__cxx11::string::_M_append
                          ((char *)&local_248,(ulong)local_1e0[0]._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e0[0]._M_dataplus._M_p != &local_1e0[0].field_2) {
                  operator_delete(local_1e0[0]._M_dataplus._M_p,
                                  local_1e0[0].field_2._M_allocated_capacity + 1);
                }
                bVar1 = false;
                bVar10 = true;
                local_2b0 = pcVar6;
                goto LAB_004a76a7;
              }
              pVar11 = consistentProperty<char_const*>(local_2b0,pcVar6,t);
              std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_2a0._M_dataplus._M_p);
              compatibilityAgree_abi_cxx11_(local_1e0,t,local_2b0 != pVar11.second);
              std::__cxx11::string::_M_append
                        ((char *)&local_248,(ulong)local_1e0[0]._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e0[0]._M_dataplus._M_p != &local_1e0[0].field_2) {
                operator_delete(local_1e0[0]._M_dataplus._M_p,
                                local_1e0[0].field_2._M_allocated_capacity + 1);
              }
              _Var3._M_current = local_278;
              pcVar9 = pVar11.second;
              if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
                _Var3._M_current = local_278;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1e0,"The INTERFACE_",0xe);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_1e0,(p->_M_dataplus)._M_p,p->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7," property of \"",0xe);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar7,(local_270->Target->Name)._M_dataplus._M_p,
                                    (local_270->Target->Name)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar7,"\" does\nnot agree with the value of ",0x23);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar7,(p->_M_dataplus)._M_p,p->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar7," already determined\nfor \"",0x19);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar7,(local_280->Target->Name)._M_dataplus._M_p,
                                    (local_280->Target->Name)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".\n",3);
                std::__cxx11::stringbuf::str();
                cmSystemTools::Error((char *)local_268,(char *)0x0,(char *)0x0,(char *)0x0);
                goto LAB_004a74a4;
              }
            }
            goto LAB_004a76a1;
          }
          if (_Var5._M_current == pbVar2) {
            local_2b0 = "";
            pcVar9 = local_2b0;
            goto LAB_004a76a1;
          }
          pVar11 = consistentProperty<char_const*>("",pcVar6,t);
          std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_2a0._M_dataplus._M_p);
          compatibilityAgree_abi_cxx11_(local_1e0,t,pVar11.second != "");
          std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_1e0[0]._M_dataplus._M_p);
          bVar1 = false;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e0[0]._M_dataplus._M_p != &local_1e0[0].field_2) {
            operator_delete(local_1e0[0]._M_dataplus._M_p,
                            local_1e0[0].field_2._M_allocated_capacity + 1);
          }
          local_2b0 = pVar11.second;
          if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
            pcVar6 = local_208;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0,"Property ",9);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1e0,(p->_M_dataplus)._M_p,p->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," on target \"",0xc);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,(local_280->Target->Name)._M_dataplus._M_p,
                                (local_280->Target->Name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" is\nimplied to be ",0x13);
            if (pcVar6 == (char *)0x0) {
              std::ios::clear((int)poVar7 + (int)poVar7->_vptr_basic_ostream[-3]);
            }
            else {
              sVar4 = strlen(pcVar6);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar6,sVar4);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,
                       " because it was used to determine the link libraries\nalready. The INTERFACE_"
                       ,0x4c);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,(p->_M_dataplus)._M_p,p->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7," property on\ndependency \"",0x19);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,(local_270->Target->Name)._M_dataplus._M_p,
                                (local_270->Target->Name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" is in conflict.\n",0x12);
            std::__cxx11::stringbuf::str();
            cmSystemTools::Error((char *)local_268,(char *)0x0,(char *)0x0,(char *)0x0);
            if (local_268 != local_258) {
              operator_delete(local_268,local_258[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
            std::ios_base::~ios_base(local_170);
            bVar1 = true;
            local_2b0 = "";
          }
        }
        else {
          if (_Var5._M_current != pbVar2) {
            pVar11 = consistentProperty<char_const*>(local_2b0,pcVar6,t);
            std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_2a0._M_dataplus._M_p);
            compatibilityAgree_abi_cxx11_(local_1e0,t,local_2b0 != pVar11.second);
            std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_1e0[0]._M_dataplus._M_p)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e0[0]._M_dataplus._M_p != &local_1e0[0].field_2) {
              operator_delete(local_1e0[0]._M_dataplus._M_p,
                              local_1e0[0].field_2._M_allocated_capacity + 1);
            }
            _Var3._M_current = local_278;
            pcVar9 = pVar11.second;
            if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
              _Var3._M_current = local_278;
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0,"Property ",9)
              ;
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1e0,(p->_M_dataplus)._M_p,p->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," on target \"",0xc);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar7,(local_280->Target->Name)._M_dataplus._M_p,
                                  (local_280->Target->Name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7,"\" does\nnot match the INTERFACE_",0x1f);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar7,(p->_M_dataplus)._M_p,p->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7," property requirement\nof dependency \"",0x25);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar7,(local_270->Target->Name)._M_dataplus._M_p,
                                  (local_270->Target->Name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".\n",3);
              std::__cxx11::stringbuf::str();
              cmSystemTools::Error((char *)local_268,(char *)0x0,(char *)0x0,(char *)0x0);
LAB_004a74a4:
              if (local_268 != local_258) {
                operator_delete(local_268,local_258[0] + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
              std::ios_base::~ios_base(local_170);
              bVar1 = true;
              goto LAB_004a76a7;
            }
          }
LAB_004a76a1:
          local_2b0 = pcVar9;
          bVar1 = false;
        }
LAB_004a76a7:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
          operator_delete(local_2a0._M_dataplus._M_p,
                          CONCAT71(local_2a0.field_2._M_allocated_capacity._1_7_,
                                   local_2a0.field_2._M_local_buf[0]) + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1f8);
      } while ((!bVar1) &&
              (ppcVar8 = local_200 + 1,
              ppcVar8 !=
              (local_218->
              super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
              )._M_impl.super__Vector_impl_data._M_finish));
    }
    pcVar6 = "(unset)";
    if (local_2b0 != (char *)0x0) {
      pcVar6 = local_2b0;
    }
    local_1e0[0]._M_dataplus._M_p = (pointer)&local_1e0[0].field_2;
    sVar4 = strlen(pcVar6);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,pcVar6,pcVar6 + sVar4);
    compatibilityType_abi_cxx11_(&local_2a0,t);
    cmGeneratorTarget::ReportPropertyOrigin(local_280,p,local_1e0,&local_248,&local_2a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,
                      CONCAT71(local_2a0.field_2._M_allocated_capacity._1_7_,
                               local_2a0.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0[0]._M_dataplus._M_p != &local_1e0[0].field_2) {
      operator_delete(local_1e0[0]._M_dataplus._M_p,local_1e0[0].field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return local_2b0;
}

Assistant:

PropertyType checkInterfacePropertyCompatibility(cmGeneratorTarget const* tgt,
                                                 const std::string& p,
                                                 const std::string& config,
                                                 const char* defaultValue,
                                                 CompatibleType t,
                                                 PropertyType* /*unused*/)
{
  PropertyType propContent = getTypedProperty<PropertyType>(tgt, p);
  std::vector<std::string> headPropKeys = tgt->GetPropertyKeys();
  const bool explicitlySet =
    std::find(headPropKeys.begin(), headPropKeys.end(), p) !=
    headPropKeys.end();

  const bool impliedByUse = tgt->IsNullImpliedByLinkLibraries(p);
  assert((impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet));

  std::vector<cmGeneratorTarget const*> const& deps =
    tgt->GetLinkImplementationClosure(config);

  if (deps.empty()) {
    return propContent;
  }
  bool propInitialized = explicitlySet;

  std::string report = " * Target \"";
  report += tgt->GetName();
  if (explicitlySet) {
    report += "\" has property content \"";
    report += valueAsString<PropertyType>(propContent);
    report += "\"\n";
  } else if (impliedByUse) {
    report += "\" property is implied by use.\n";
  } else {
    report += "\" property not set.\n";
  }

  std::string interfaceProperty = "INTERFACE_" + p;
  for (std::vector<cmGeneratorTarget const*>::const_iterator li = deps.begin();
       li != deps.end(); ++li) {
    // An error should be reported if one dependency
    // has INTERFACE_POSITION_INDEPENDENT_CODE ON and the other
    // has INTERFACE_POSITION_INDEPENDENT_CODE OFF, or if the
    // target itself has a POSITION_INDEPENDENT_CODE which disagrees
    // with a dependency.

    cmGeneratorTarget const* theTarget = *li;

    std::vector<std::string> propKeys = theTarget->GetPropertyKeys();

    const bool ifaceIsSet = std::find(propKeys.begin(), propKeys.end(),
                                      interfaceProperty) != propKeys.end();
    PropertyType ifacePropContent =
      getTypedProperty<PropertyType>(theTarget, interfaceProperty);

    std::string reportEntry;
    if (ifaceIsSet) {
      reportEntry += " * Target \"";
      reportEntry += theTarget->GetName();
      reportEntry += "\" property value \"";
      reportEntry += valueAsString<PropertyType>(ifacePropContent);
      reportEntry += "\" ";
    }

    if (explicitlySet) {
      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" does\nnot match the "
               "INTERFACE_"
            << p << " property requirement\nof "
                    "dependency \""
            << theTarget->GetName() << "\".\n";
          cmSystemTools::Error(e.str().c_str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Explicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (impliedByUse) {
      propContent = impliedValue<PropertyType>(propContent);

      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" is\nimplied to be " << defaultValue
            << " because it was used to determine the link libraries\n"
               "already. The INTERFACE_"
            << p << " property on\ndependency \"" << theTarget->GetName()
            << "\" is in conflict.\n";
          cmSystemTools::Error(e.str().c_str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Implicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (ifaceIsSet) {
      if (propInitialized) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "The INTERFACE_" << p << " property of \""
            << theTarget->GetName() << "\" does\nnot agree with the value of "
            << p << " already determined\nfor \"" << tgt->GetName() << "\".\n";
          cmSystemTools::Error(e.str().c_str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      report += reportEntry + "(Interface set)\n";
      propContent = ifacePropContent;
      propInitialized = true;
    } else {
      // Not set. Nothing to agree on.
      continue;
    }
  }

  tgt->ReportPropertyOrigin(p, valueAsString<PropertyType>(propContent),
                            report, compatibilityType(t));
  return propContent;
}